

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fog.cpp
# Opt level: O2

int AF_A_FogSpawn(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  int iVar3;
  AActor *pAVar4;
  AActor *this_00;
  int iVar5;
  char *__assertion;
  FName local_3c;
  DVector3 local_38;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0053ba5c;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (AActor *)0x0) {
LAB_0053b8a1:
        this_00 = (AActor *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf((DObject *)this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_0053ba5c;
        }
      }
      if (numparam == 1) goto LAB_0053b921;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_0053ba4c;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_0053ba5c;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_0053ba4c;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0053b921:
        iVar3 = this_00->special1;
        this_00->special1 = iVar3 + -1;
        if (iVar3 < 1) {
          this_00->special1 = this_00->args[2];
          iVar3 = FRandom::operator()(&pr_fogspawn);
          FName::FName(&local_3c,
                       _ZZL13AF_A_FogSpawnP12VMFrameStackP7VMValueiP8VMReturniE4fogs_rel +
                       *(int *)(_ZZL13AF_A_FogSpawnP12VMFrameStackP7VMValueiP8VMReturniE4fogs_rel +
                               (long)(iVar3 % 3) * 4));
          local_38.X = (this_00->__Pos).X;
          local_38.Y = (this_00->__Pos).Y;
          local_38.Z = (this_00->__Pos).Z;
          pAVar4 = Spawn(&local_3c,&local_38,ALLOW_REPLACE);
          if (pAVar4 != (AActor *)0x0) {
            iVar5 = this_00->args[1] + (uint)(this_00->args[1] == 0);
            iVar3 = FRandom::operator()(&pr_fogspawn);
            (pAVar4->Angles).Yaw.Degrees =
                 (double)(iVar3 % iVar5 - (iVar5 >> 1)) * 1.40625 + (this_00->Angles).Yaw.Degrees;
            (pAVar4->target).field_0.p = this_00;
            if (this_00->args[0] < 1) {
              this_00->args[0] = 1;
            }
            iVar3 = FRandom::operator()(&pr_fogspawn);
            pAVar4->args[0] = iVar3 % this_00->args[0] + 1;
            pAVar4->args[3] = this_00->args[3];
            pAVar4->args[4] = 1;
            iVar3 = FRandom::operator()(&pr_fogspawn);
            pAVar4->WeaveIndexZ = (byte)iVar3 & 0x3f;
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_0053ba5c;
    }
    if (this_00 == (AActor *)0x0) goto LAB_0053b8a1;
  }
LAB_0053ba4c:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_0053ba5c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fog.cpp"
                ,0x1e,"int AF_A_FogSpawn(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FogSpawn)
{
	PARAM_ACTION_PROLOGUE;

	static const char *fogs[3] =
	{
		"FogPatchSmall",
		"FogPatchMedium",
		"FogPatchLarge"
	};

	AActor *mo = NULL;
	int delta;

	if (self->special1-- > 0)
	{
		return 0;
	}
	self->special1 = self->args[2];		// Reset frequency count

	mo = Spawn (fogs[pr_fogspawn()%3], self->Pos(), ALLOW_REPLACE);

	if (mo)
	{
		delta = self->args[1];
		if (delta==0) delta=1;
		mo->Angles.Yaw = self->Angles.Yaw + (((pr_fogspawn() % delta) - (delta >> 1)) * (360 / 256.));
		mo->target = self;
		if (self->args[0] < 1) self->args[0] = 1;
		mo->args[0] = (pr_fogspawn() % (self->args[0]))+1;	// Random speed
		mo->args[3] = self->args[3];						// Set lifetime
		mo->args[4] = 1;									// Set to moving
		mo->WeaveIndexZ = pr_fogspawn()&63;
	}
	return 0;
}